

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttsvg.c
# Opt level: O3

void tt_face_free_svg(TT_Face face)

{
  void *P;
  FT_Memory memory;
  
  P = face->svg;
  if (P != (void *)0x0) {
    memory = (face->root).memory;
    FT_Stream_ReleaseFrame((face->root).stream,(FT_Byte **)((long)P + 0x10));
    ft_mem_free(memory,P);
    return;
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  tt_face_free_svg( TT_Face  face )
  {
    FT_Memory  memory = face->root.memory;
    FT_Stream  stream = face->root.stream;

    Svg*  svg = (Svg*)face->svg;


    if ( svg )
    {
      FT_FRAME_RELEASE( svg->table );
      FT_FREE( svg );
    }
  }